

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double obj_amp)

{
  undefined1 auVar1 [16];
  int k;
  long lVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar3;
  rc_size rVar4;
  _Head_base<0UL,_int_*,_false> _Var5;
  long lVar6;
  rc_data *__last;
  long lVar7;
  int iVar8;
  rc_data *__first;
  undefined8 uVar9;
  int r_size;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_80 [16];
  _Head_base<0UL,_int_*,_false> local_70;
  undefined8 local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_60;
  double local_58;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_50;
  double local_48;
  double local_40;
  int *local_38;
  
  if (first._M_current == last._M_current) {
    uVar9._0_4_ = 0;
    uVar9._4_4_ = 0;
  }
  else {
    local_60._M_head_impl = (row_value *)(this + 0x10);
    uVar9._0_4_ = 0;
    uVar9._4_4_ = 0;
    local_70._M_head_impl = last._M_current;
    local_58 = theta;
    local_50._M_head_impl = (col_value *)kappa;
    local_48 = delta;
    local_40 = obj_amp;
    do {
      k = *first._M_current;
      local_38 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_80,(int)local_60._M_head_impl);
      if (local_80._8_8_ != local_80._0_8_) {
        lVar6 = *(long *)(this + 0x50);
        _Var5._M_head_impl = (int *)local_80._8_8_;
        do {
          *(double *)(lVar6 + (long)*_Var5._M_head_impl * 8) =
               local_58 * *(double *)(lVar6 + (long)*_Var5._M_head_impl * 8);
          _Var5._M_head_impl = _Var5._M_head_impl + 8;
        } while (_Var5._M_head_impl != (int *)local_80._0_8_);
      }
      rVar4 = solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                          *)this,(row_iterator)local_80._8_8_,(row_iterator)local_80._0_8_,x);
      r_size = rVar4.r_size;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_40;
      if (r_size != 0) {
        lVar6 = *(long *)(this + 0x60);
        lVar2 = *(long *)(*(long *)(this + 0x78) + 8);
        lVar7 = 0;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               *(ulong *)(lVar2 + (long)((row_iterator)
                                        (local_80._8_8_ + (long)*(int *)(lVar6 + 0xc + lVar7) * 8))
                                        ->column * 8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(lVar6 + lVar7);
          auVar1 = vfmadd213sd_fma(auVar10,auVar11,auVar1);
          *(long *)(lVar6 + lVar7) = auVar1._0_8_;
          lVar7 = lVar7 + 0x10;
        } while (((ulong)rVar4 & 0xffffffff) << 4 != lVar7);
      }
      if (1 < (long)r_size) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x60);
        lVar6 = (long)rVar4 << 0x20;
        local_68 = uVar9;
        if (lVar6 != 0) {
          lVar2 = (long)&__first->value + (lVar6 >> 0x1c);
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,lVar2,(int)LZCOUNT((long)r_size) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,lVar2);
        }
        __last = __first + 1;
        if (lVar6 != 0x100000000) {
          lVar6 = (lVar6 >> 0x1c) + -0x10;
          do {
            if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last,__g);
              __first = __last;
            }
            __last = __last + 1;
            lVar6 = lVar6 + -0x10;
          } while (lVar6 != 0);
        }
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        last._M_current = local_70._M_head_impl;
        uVar9 = local_68;
      }
      iVar8 = rVar4.c_size + *(int *)(*(long *)(this + 0x68) + (long)k * 8);
      if (r_size < iVar8) {
        iVar8 = r_size;
      }
      bVar3 = affect<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                          *)this,x,(row_value *)local_80._8_8_,k,iVar8 + -1,r_size,
                         (double)local_50._M_head_impl,local_48);
      uVar9._0_1_ = (byte)uVar9 | bVar3;
      first._M_current = local_38 + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)uVar9 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }